

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

Index __thiscall
wasm::StackIROptimizer::getNumConsumedValues(StackIROptimizer *this,StackInst *inst)

{
  bool bVar1;
  size_t sVar2;
  SmallVector<wasm::Expression_**,_4UL> local_60;
  StackInst *local_20;
  StackInst *inst_local;
  StackIROptimizer *this_local;
  
  local_20 = inst;
  inst_local = (StackInst *)this;
  bVar1 = isControlFlow(this,inst);
  if (bVar1) {
    if (local_20->op == IfBegin) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    ChildIterator::ChildIterator((ChildIterator *)&local_60,local_20->origin);
    sVar2 = SmallVector<wasm::Expression_**,_4UL>::size(&local_60);
    this_local._4_4_ = (Index)sVar2;
    ChildIterator::~ChildIterator((ChildIterator *)&local_60);
  }
  return this_local._4_4_;
}

Assistant:

Index StackIROptimizer::getNumConsumedValues(StackInst* inst) {
  if (isControlFlow(inst)) {
    // If consumes 1; that's it.
    if (inst->op == StackInst::IfBegin) {
      return 1;
    }
    return 0;
  }
  // Otherwise, for basic instructions, just count the expression children.
  return ChildIterator(inst->origin).children.size();
}